

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * mkvparser::Cluster::Create(Segment *pSegment,long idx,longlong off)

{
  long lVar1;
  Segment *this;
  Segment *local_60;
  Cluster *pCluster;
  longlong element_start;
  longlong off_local;
  long idx_local;
  Segment *pSegment_local;
  
  if ((pSegment == (Segment *)0x0) || (off < 0)) {
    pSegment_local = (Segment *)0x0;
  }
  else {
    lVar1 = pSegment->m_start;
    this = (Segment *)operator_new(0x48,(nothrow_t *)&std::nothrow);
    local_60 = (Segment *)0x0;
    if (this != (Segment *)0x0) {
      Cluster((Cluster *)this,pSegment,idx,lVar1 + off);
      local_60 = this;
    }
    pSegment_local = local_60;
  }
  return (Cluster *)pSegment_local;
}

Assistant:

Cluster* Cluster::Create(Segment* pSegment, long idx, long long off) {
  if (!pSegment || off < 0)
    return NULL;

  const long long element_start = pSegment->m_start + off;

  Cluster* const pCluster =
      new (std::nothrow) Cluster(pSegment, idx, element_start);

  return pCluster;
}